

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void shkgone(monst *mtmp)

{
  char *pcVar1;
  level *lev;
  xchar xVar2;
  boolean bVar3;
  mkroom *pmVar4;
  mkroom *pmVar5;
  int local_40;
  int local_3c;
  int sy;
  int sx;
  char *p;
  obj *otmp;
  mkroom *sroom;
  level *shoplev;
  eshk *eshk;
  monst *mtmp_local;
  
  xVar2 = ledger_no((d_level *)&mtmp[0x1b].mxlth);
  lev = levels[xVar2];
  pmVar4 = lev->rooms + ((char)mtmp[0x1b].meating + -3);
  remove_damage(mtmp,'\x01');
  pmVar4->resident = (monst *)0x0;
  pmVar5 = search_special(lev,-2);
  if (pmVar5 == (mkroom *)0x0) {
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffffe;
  }
  for (local_3c = (int)pmVar4->lx; local_3c <= pmVar4->hx; local_3c = local_3c + 1) {
    for (local_40 = (int)pmVar4->ly; local_40 <= pmVar4->hy; local_40 = local_40 + 1) {
      for (p = (char *)lev->objects[local_3c][local_40]; p != (char *)0x0; p = *(char **)(p + 8)) {
        *(uint *)(p + 0x4a) = *(uint *)(p + 0x4a) & 0xfffffff7;
      }
    }
  }
  bVar3 = on_level((d_level *)&mtmp[0x1b].mxlth,&mtmp->dlevel->z);
  if ((bVar3 != '\0') && (_sy = strchr(u.ushops,(int)(char)mtmp[0x1b].meating), _sy != (char *)0x0))
  {
    setpaid(mtmp);
    mtmp[0x1b].mnum = 0;
    mtmp[0x1b].m_lev = '\0';
    mtmp[0x1b].mx = '\0';
    mtmp[0x1b].my = '\0';
    mtmp[0x1b].mux = '\0';
    mtmp[0x1b].muy = '\0';
    mtmp[0x1b].malign = '\0';
    do {
      *_sy = _sy[1];
      pcVar1 = _sy + 1;
      _sy = _sy + 1;
    } while (*pcVar1 != '\0');
  }
  return;
}

Assistant:

void shkgone(struct monst *mtmp)
{
	struct eshk *eshk = ESHK(mtmp);
	struct level *shoplev = levels[ledger_no(&eshk->shoplevel)];
	struct mkroom *sroom = &shoplev->rooms[eshk->shoproom - ROOMOFFSET];
	struct obj *otmp;
	char *p;
	int sx, sy;

	remove_damage(mtmp, TRUE);
	sroom->resident = NULL;
	if (!search_special(shoplev, ANY_SHOP))
	    shoplev->flags.has_shop = 0;

	/* items on shop floor revert to ordinary objects */
	for (sx = sroom->lx; sx <= sroom->hx; sx++)
	    for (sy = sroom->ly; sy <= sroom->hy; sy++)
	    for (otmp = shoplev->objects[sx][sy]; otmp; otmp = otmp->nexthere)
		otmp->no_charge = 0;

	if (on_level(&eshk->shoplevel, &mtmp->dlevel->z)) {
	    /* Make sure bill is set only when the
	       dead shk is the resident shk. */
	    if ((p = strchr(u.ushops, eshk->shoproom)) != 0) {
		setpaid(mtmp);
		eshk->bill_p = NULL;
		/* remove eshk->shoproom from u.ushops */
		do { *p = *(p + 1); } while (*++p);
	    }
	}
}